

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe7At6(uint8_t *buf)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (buf[1] & 0x1f) << 2;
  uVar3 = (ulong)(*buf >> 6 | uVar2);
  uVar1 = uVar3 - 0x80;
  if (uVar2 < 0x40) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe7At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x7f);

    if (res >> 6) {
        res |= UINT64_C(0xffffffffffffff80);
    }

    return static_cast<std::int64_t>(res);
}